

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_typed_array_join(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,
                           int toLocaleString)

{
  JSValue val;
  JSValue val_00;
  JSValue v;
  JSValue v_00;
  JSValue this_obj;
  JSValue v_01;
  int iVar1;
  int iVar2;
  int in_ECX;
  JSValue *in_R8;
  int in_R9D;
  JSValue JVar3;
  int c;
  int n;
  int i;
  JSString *p;
  StringBuffer *b;
  StringBuffer b_s;
  JSValue el;
  JSValue sep;
  uint32_t in_stack_ffffffffffffff28;
  uint32_t in_stack_ffffffffffffff2c;
  JSValueUnion in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  uint32_t in_stack_ffffffffffffff3c;
  JSValueUnion in_stack_ffffffffffffff40;
  JSValueUnion in_stack_ffffffffffffff48;
  JSValueUnion in_stack_ffffffffffffff50;
  JSValueUnion JVar4;
  int64_t in_stack_ffffffffffffff58;
  uint local_9c;
  int local_94;
  undefined1 local_10 [8];
  int64_t local_8;
  
  JVar3.tag = (int64_t)in_stack_ffffffffffffff48.ptr;
  JVar3.u.ptr = in_stack_ffffffffffffff40.ptr;
  iVar1 = js_typed_array_get_length_internal
                    ((JSContext *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                     JVar3);
  if (iVar1 < 0) {
LAB_001c3940:
    local_10 = (undefined1  [8])(stack0xfffffffffffffff4 << 0x20);
    local_8 = 6;
  }
  else {
    local_9c = 0x2c;
    if (((in_R9D == 0) && (0 < in_ECX)) && (iVar2 = JS_IsUndefined(*in_R8), iVar2 == 0)) {
      val.u._4_4_ = in_stack_ffffffffffffff2c;
      val.u.int32 = in_stack_ffffffffffffff28;
      val.tag = (int64_t)in_stack_ffffffffffffff30.ptr;
      JVar3 = JS_ToString((JSContext *)0x1c36c1,val);
      JVar4 = JVar3.u;
      in_stack_ffffffffffffff58 = JVar3.tag;
      in_stack_ffffffffffffff50 = JVar4;
      iVar2 = JS_IsException(JVar3);
      if (iVar2 != 0) goto LAB_001c3940;
      if ((((uint)*(undefined8 *)((long)JVar4.ptr + 4) & 0x7fffffff) == 1) &&
         ((*(ulong *)((long)JVar4.ptr + 4) >> 0x1f & 1) == 0)) {
        local_9c = (uint)*(byte *)((long)JVar4.ptr + 0x10);
      }
      else {
        local_9c = 0xffffffff;
      }
    }
    string_buffer_init((JSContext *)in_stack_ffffffffffffff30.ptr,
                       (StringBuffer *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28)
                       ,0);
    for (local_94 = 0; local_94 < iVar1; local_94 = local_94 + 1) {
      if (0 < local_94) {
        if ((int)local_9c < 0) {
          iVar2 = string_buffer_concat
                            ((StringBuffer *)
                             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                             (JSString *)in_stack_ffffffffffffff30.ptr,in_stack_ffffffffffffff2c,
                             in_stack_ffffffffffffff28);
        }
        else {
          iVar2 = string_buffer_putc8((StringBuffer *)
                                      CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                                      0);
        }
        if (iVar2 == 0) goto LAB_001c37d5;
LAB_001c3919:
        string_buffer_free((StringBuffer *)0x1c3923);
        v_00.u._4_4_ = in_stack_ffffffffffffff3c;
        v_00.u.int32 = in_stack_ffffffffffffff38;
        v_00.tag = (int64_t)in_stack_ffffffffffffff40.ptr;
        JS_FreeValue((JSContext *)in_stack_ffffffffffffff30.ptr,v_00);
        goto LAB_001c3940;
      }
LAB_001c37d5:
      this_obj.tag = (int64_t)in_stack_ffffffffffffff50.ptr;
      this_obj.u.float64 = in_stack_ffffffffffffff48.float64;
      JVar3 = JS_GetPropertyUint32
                        ((JSContext *)in_stack_ffffffffffffff40.ptr,this_obj,
                         in_stack_ffffffffffffff3c);
      in_stack_ffffffffffffff40 = JVar3.u;
      in_stack_ffffffffffffff48 = (JSValueUnion)JVar3.tag;
      iVar2 = JS_IsNull(JVar3);
      if ((iVar2 == 0) && (iVar2 = JS_IsUndefined(JVar3), iVar2 == 0)) {
        iVar2 = JS_IsException(JVar3);
        if (iVar2 == 0) {
          if (in_R9D != 0) {
            val_00.u._4_4_ = in_stack_ffffffffffffff2c;
            val_00.u.int32 = in_stack_ffffffffffffff28;
            val_00.tag = (int64_t)in_stack_ffffffffffffff30.ptr;
            JVar3 = JS_ToLocaleStringFree((JSContext *)0x1c388d,val_00);
            in_stack_ffffffffffffff30 = JVar3.u;
            in_stack_ffffffffffffff38 = (undefined4)JVar3.tag;
            in_stack_ffffffffffffff3c = JVar3.tag._4_4_;
          }
          v_01.tag = in_stack_ffffffffffffff58;
          v_01.u.float64 = in_stack_ffffffffffffff50.float64;
          iVar2 = string_buffer_concat_value_free
                            ((StringBuffer *)in_stack_ffffffffffffff48.ptr,v_01);
          if (iVar2 == 0) goto LAB_001c38ce;
        }
        goto LAB_001c3919;
      }
LAB_001c38ce:
    }
    v.u._4_4_ = in_stack_ffffffffffffff3c;
    v.u.int32 = in_stack_ffffffffffffff38;
    v.tag = (int64_t)in_stack_ffffffffffffff40.ptr;
    JS_FreeValue((JSContext *)in_stack_ffffffffffffff30.ptr,v);
    _local_10 = string_buffer_end((StringBuffer *)in_stack_ffffffffffffff30.ptr);
  }
  return _local_10;
}

Assistant:

static JSValue js_typed_array_join(JSContext *ctx, JSValueConst this_val,
                                   int argc, JSValueConst *argv, int toLocaleString)
{
    JSValue sep = JS_UNDEFINED, el;
    StringBuffer b_s, *b = &b_s;
    JSString *p = NULL;
    int i, n;
    int c;

    n = js_typed_array_get_length_internal(ctx, this_val);
    if (n < 0)
        goto exception;

    c = ',';    /* default separator */
    if (!toLocaleString && argc > 0 && !JS_IsUndefined(argv[0])) {
        sep = JS_ToString(ctx, argv[0]);
        if (JS_IsException(sep))
            goto exception;
        p = JS_VALUE_GET_STRING(sep);
        if (p->len == 1 && !p->is_wide_char)
            c = p->u.str8[0];
        else
            c = -1;
    }
    string_buffer_init(ctx, b, 0);

    /* XXX: optimize with direct access */
    for(i = 0; i < n; i++) {
        if (i > 0) {
            if (c >= 0) {
                if (string_buffer_putc8(b, c))
                    goto fail;
            } else {
                if (string_buffer_concat(b, p, 0, p->len))
                    goto fail;
            }
        }
        el = JS_GetPropertyUint32(ctx, this_val, i);
        /* Can return undefined for example if the typed array is detached */
        if (!JS_IsNull(el) && !JS_IsUndefined(el)) {
            if (JS_IsException(el))
                goto fail;
            if (toLocaleString) {
                el = JS_ToLocaleStringFree(ctx, el);
            }
            if (string_buffer_concat_value_free(b, el))
                goto fail;
        }
    }
    JS_FreeValue(ctx, sep);
    return string_buffer_end(b);

fail:
    string_buffer_free(b);
    JS_FreeValue(ctx, sep);
exception:
    return JS_EXCEPTION;
}